

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_ASCIIHexDecode.hh
# Opt level: O2

Pipeline * __thiscall SF_ASCIIHexDecode::getDecodePipeline(SF_ASCIIHexDecode *this,Pipeline *next)

{
  __shared_ptr<Pl_ASCIIHexDecoder,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  Pipeline *local_18;
  
  local_18 = next;
  std::make_shared<Pl_ASCIIHexDecoder,char_const(&)[16],Pipeline*&>
            ((char (*) [16])&_Stack_28,(Pipeline **)"asciiHex decode");
  std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&this->pipeline,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return (this->pipeline).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

Pipeline*
    getDecodePipeline(Pipeline* next) override
    {
        this->pipeline = std::make_shared<Pl_ASCIIHexDecoder>("asciiHex decode", next);
        return this->pipeline.get();
    }